

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

char * __thiscall Catch::StringRef::c_str(StringRef *this)

{
  string local_40;
  ReusableStringStream local_20;
  
  if (this->m_start[this->m_size] == '\0') {
    return this->m_start;
  }
  ReusableStringStream::ReusableStringStream(&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.m_oss,"Called StringRef::c_str() on a non-null-terminated instance",0x3b);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_40);
}

Assistant:

constexpr auto isNullTerminated() const noexcept -> bool {
            return m_start[m_size] == '\0';
        }